

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_23(QPDF *pdf,char *arg2)

{
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  QPDFPageDocumentHelper dh;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> avStack_78 [8];
  long local_70;
  QPDFPageDocumentHelper local_60;
  QPDFPageObjectHelper local_40;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_60,pdf);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageObjectHelper::QPDFPageObjectHelper(&local_40,(QPDFPageObjectHelper *)(local_70 + -0x38));
  QPDFPageDocumentHelper::removePage((QPDFPageObjectHelper *)&local_60);
  QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_40);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(avStack_78);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_60);
  return;
}

Assistant:

static void
test_23(QPDF& pdf, char const* arg2)
{
    QPDFPageDocumentHelper dh(pdf);
    std::vector<QPDFPageObjectHelper> pages = dh.getAllPages();
    dh.removePage(pages.back());
}